

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::move_backward
          (InnerLeaf<4> *this,int *first,int *last)

{
  long lVar1;
  
  std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
  __copy_move_b<HighsHashTableEntry<std::pair<int,int>,double>*,HighsHashTableEntry<std::pair<int,int>,double>*>
            ((this->entries)._M_elems + *first,(this->entries)._M_elems + *last,
             (this->entries)._M_elems + (long)*last + 1);
  lVar1 = (long)*first;
  memmove((this->hashes)._M_elems + lVar1 + 1,(this->hashes)._M_elems + lVar1,(*last - lVar1) * 8);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }